

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::slackColSubstitution<HighsTripletTreeSlicePreOrder>
          (HighsPostsolveStack *this,HighsInt row,HighsInt col,double rhs,
          HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *rowVec)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  undefined8 in_RCX;
  int in_EDX;
  int __c;
  int in_ESI;
  iterator *rhs_00;
  HighsDataStack *in_RDI;
  HighsSliceNonzero *rowVal;
  iterator __end0;
  iterator __begin0;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *__range2;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *in_stack_fffffffffffffef8;
  iterator *in_stack_ffffffffffffff00;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *in_stack_ffffffffffffff08;
  ReductionType type;
  HighsPostsolveStack *in_stack_ffffffffffffff10;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff18;
  iterator local_a8;
  iterator local_68;
  undefined8 local_28;
  undefined8 local_20;
  int local_10;
  int local_c;
  
  local_20 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ::clear((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           *)0x726f97);
  local_28 = local_20;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin(in_stack_ffffffffffffff08);
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::end(in_stack_fffffffffffffef8);
  while( true ) {
    rhs_00 = &local_a8;
    bVar1 = HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator!=(&local_68,rhs_00);
    if (!bVar1) break;
    this_00 = HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator*(&local_68);
    in_stack_ffffffffffffff10 =
         (HighsPostsolveStack *)
         &in_RDI[5].data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8;
    in_stack_ffffffffffffff08 = (HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *)(in_RDI + 3);
    pcVar2 = HighsSliceNonzero::index(this_00,(char *)rhs_00,__c);
    in_stack_ffffffffffffff18 =
         (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *)std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08,
                       (long)(int)pcVar2);
    HighsSliceNonzero::value(this_00);
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                *)in_stack_ffffffffffffff10,(int *)in_stack_ffffffffffffff08,
               (double *)in_stack_ffffffffffffff00);
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(in_stack_ffffffffffffff00)
    ;
  }
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::~iterator((iterator *)0x726ff2);
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::~iterator((iterator *)0x726fff);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)&in_RDI[3].position,(long)local_c);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)local_10);
  HighsDataStack::push<presolve::HighsPostsolveStack::SlackColSubstitution,_0>
            ((HighsDataStack *)in_stack_ffffffffffffff10,
             (SlackColSubstitution *)in_stack_ffffffffffffff08);
  type = (ReductionType)((ulong)in_stack_ffffffffffffff08 >> 0x38);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(in_RDI,in_stack_ffffffffffffff18);
  reductionAdded(in_stack_ffffffffffffff10,type);
  return;
}

Assistant:

void slackColSubstitution(HighsInt row, HighsInt col, double rhs,
                            const HighsMatrixSlice<RowStorageFormat>& rowVec) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : rowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    reductionValues.push(
        SlackColSubstitution{rhs, origRowIndex[row], origColIndex[col]});
    reductionValues.push(rowValues);
    reductionAdded(ReductionType::kSlackColSubstitution);
  }